

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Transpose(TransposeForm2 Transpose)

{
  byte bVar1;
  uint32_t uVar2;
  const_reference pvVar3;
  code *in_RDI;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  uint32_t in_stack_ffffffffffffff3c;
  uint8_t value;
  undefined2 uVar4;
  uint8_t in_stack_ffffffffffffff46;
  uint8_t alignment_;
  uint8_t in_stack_ffffffffffffff47;
  uint8_t colorCount_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar6;
  undefined7 in_stack_ffffffffffffff58;
  uchar in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint8_t in_stack_ffffffffffffff6f;
  ImageTemplate<unsigned_char> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  this = &local_20;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff3c);
  value = (uint8_t)(in_stack_ffffffffffffff3c >> 0x18);
  uVar5 = 0;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  uVar6 = CONCAT13(*pvVar3,(int3)in_stack_ffffffffffffff54);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar6,uVar5),(uint32_t)((ulong)this >> 0x20),
             (uint32_t)this,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46);
  Test_Helper::uniformImage
            (in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
             (Image *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5d02);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  uVar4 = (undefined2)uVar2;
  alignment_ = (uint8_t)(uVar2 >> 0x10);
  colorCount_ = (uint8_t)(uVar2 >> 0x18);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar6,uVar5),(uint32_t)((ulong)this >> 0x20),
             (uint32_t)this,colorCount_,alignment_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,1);
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5f
            );
  (*local_8)(&local_48,&stack0xffffffffffffff58);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(colorCount_,CONCAT16(alignment_,CONCAT24(uVar4,uVar2))),value
                    );
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5dad);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e5dba);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar6,uVar5));
  return (bool)(bVar1 & 1);
}

Assistant:

bool form2_Transpose(TransposeForm2 Transpose)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        const PenguinV_Image::Image input  = uniformImage( intensity[0] );
        PenguinV_Image::Image output( input.height(), input.width() );

        output.fill( intensity[1] );

        Transpose( input, output );

        return verifyImage( output, intensity[0] );
    }